

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptNativeFloatArray::SetItem
          (JavascriptNativeFloatArray *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  TypeId TVar1;
  double dStack_30;
  TypeId typeId;
  double dValue;
  Var pvStack_20;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptNativeFloatArray *pJStack_10;
  uint32 index_local;
  JavascriptNativeFloatArray *this_local;
  
  dValue._4_4_ = flags;
  pvStack_20 = value;
  value_local._4_4_ = index;
  pJStack_10 = this;
  TVar1 = TrySetNativeFloatArrayItem(this,value,&stack0xffffffffffffffd0);
  if (TVar1 == TypeIds_ArrayLast) {
    SetItem(this,value_local._4_4_,dStack_30);
  }
  else {
    Js::JavascriptArray::DirectSetItemAt<void*>
              ((JavascriptArray *)this,value_local._4_4_,pvStack_20);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeFloatArray::SetItem(uint32 index, Var value, PropertyOperationFlags flags)
    {
        double dValue;
        TypeId typeId = this->TrySetNativeFloatArrayItem(value, &dValue);
        if (typeId == TypeIds_NativeFloatArray)
        {
            this->SetItem(index, dValue);
        }
        else
        {
            this->DirectSetItemAt(index, value);
        }
        return TRUE;
    }